

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so2.hpp
# Opt level: O1

void __thiscall
Sophus::SO2Base<Sophus::SO2<float,_0>_>::normalize(SO2Base<Sophus::SO2<float,_0>_> *this)

{
  float fVar1;
  
  fVar1 = *(float *)this * *(float *)this + *(float *)(this + 4) * *(float *)(this + 4);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  if (fVar1 < 1e-05) {
    defaultEnsure<>("void Sophus::SO2Base<Sophus::SO2<float>>::normalize() [Derived = Sophus::SO2<float>]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/powei-lin[P]OpticalFlowTracker/thirdparty/Sophus/sophus/so2.hpp"
                    ,0x8a,"Complex number should not be close to zero!");
  }
  *(float *)this = *(float *)this / fVar1;
  *(float *)(this + 4) = *(float *)(this + 4) / fVar1;
  return;
}

Assistant:

SOPHUS_FUNC void normalize() {
    Scalar length = std::sqrt(unit_complex().x() * unit_complex().x() +
                              unit_complex().y() * unit_complex().y());
    SOPHUS_ENSURE(length >= Constants<Scalar>::epsilon(),
                  "Complex number should not be close to zero!");
    unit_complex_nonconst().x() /= length;
    unit_complex_nonconst().y() /= length;
  }